

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O1

void P_AddSectorLinksByID(sector_t *control,int id,INTBOOL ceiling)

{
  extsector_t *peVar1;
  sector_t *sector;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FLineIdIterator itr;
  FLineIdIterator local_38;
  
  peVar1 = control->e;
  local_38.start = tagManager.IDHashFirst[(ulong)(uint)id & 0xff];
  local_38.searchtag = id;
  uVar2 = FLineIdIterator::Next(&local_38);
  if (-1 < (int)uVar2) {
    do {
      if ((lines[uVar2].special == 0xbe) && (lines[uVar2].args[1] == 3)) {
        uVar3 = lines[uVar2].args[3];
        sector = lines[uVar2].frontsector;
        if (sector == control) {
          if (ceiling == 0) {
            uVar3 = uVar3 & 0xfffffffe;
          }
          else {
            uVar3 = uVar3 & 0xfffffffd;
          }
        }
        uVar4 = (uint)((uVar3 & 5) != 4) * 5 + 10 & uVar3;
        uVar2 = uVar4 & 5;
        if ((uVar3 & 10) != 8) {
          uVar2 = uVar4;
        }
        if ((sector != (sector_t *)0x0) && (uVar2 != 0)) {
          AddSingleSector(&(peVar1->Linked).Floor + (ceiling != 0),sector,uVar2);
        }
      }
      uVar2 = FLineIdIterator::Next(&local_38);
    } while (-1 < (int)uVar2);
  }
  return;
}

Assistant:

void P_AddSectorLinksByID(sector_t *control, int id, INTBOOL ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? control->e->Linked.Ceiling : control->e->Linked.Floor;

	FLineIdIterator itr(id);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		line_t *ld = &lines[line];

		if (ld->special == Static_Init && ld->args[1] == Init_SectorLink)
		{
			int movetype = ld->args[3];

			// [GZ] Eternity does allow the attached sector to be the control sector, 
			// this permits elevator effects (ceiling attached to floors), so instead
			// of checking whether the two sectors are the same, we prevent a plane
			// from being attached to itself. This should be enough to do the trick.
			if (ld->frontsector == control)
			{
				if (ceiling)	movetype &= ~LINK_CEILING;
				else			movetype &= ~LINK_FLOOR;
			}

			// Make sure we have only valid combinations
			movetype &= LINK_FLAGMASK;
			if ((movetype & LINK_FLOORMIRROR) == LINK_FLOORMIRRORFLAG) movetype &= ~LINK_FLOORMIRRORFLAG;
			if ((movetype & LINK_CEILINGMIRROR) == LINK_CEILINGMIRRORFLAG) movetype &= ~LINK_CEILINGMIRRORFLAG;

			if (movetype != 0 && ld->frontsector != NULL)//&& ld->frontsector != control) Needs to be allowed!
			{
				AddSingleSector(scrollplane, ld->frontsector, movetype);
			}
		}
	}
}